

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_picker.cpp
# Opt level: O2

add_hashes_result * __thiscall
libtorrent::aux::hash_picker::add_hashes
          (add_hashes_result *__return_storage_ptr__,hash_picker *this,hash_request *req,
          span<const_libtorrent::digest32<256L>_> hashes)

{
  pointer pmVar1;
  span<const_libtorrent::digest32<256L>_> uncle_hashes;
  int iVar2;
  int iVar3;
  int iVar4;
  piece_index_t file_piece_offset;
  int iVar5;
  long lVar6;
  span<const_libtorrent::digest32<256L>_> hashes_00;
  add_hashes_result ret;
  optional<libtorrent::aux::add_hashes_result_t> results;
  
  iVar2 = file_storage::file_num_pieces(this->m_files,(file_index_t)(req->file).m_val);
  iVar2 = iVar2 - req->index;
  iVar3 = req->count;
  if (iVar3 <= iVar2) {
    iVar2 = iVar3;
  }
  iVar3 = merkle_num_leafs(iVar3);
  iVar4 = merkle_num_layers(iVar3);
  iVar4 = req->proof_layers - iVar4;
  iVar3 = -1;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  iVar4 = req->count;
  if ((long)(iVar3 + iVar4 + 1) == hashes.m_len) {
    iVar3 = req->base;
    iVar5 = this->m_piece_layer;
    if (iVar4 != 0x200 && iVar3 == iVar5) {
      if ((0x200 < iVar4) ||
         (iVar3 = file_storage::file_num_pieces(this->m_files,(file_index_t)(req->file).m_val),
         iVar2 != iVar3 - req->index)) goto LAB_001b8e8f;
      iVar3 = req->base;
      iVar5 = this->m_piece_layer;
    }
    if ((iVar3 == 0) || (iVar3 == iVar5)) {
      lVar6 = (long)req->count;
      iVar3 = file_num_layers(this,(file_index_t)(req->file).m_val);
      iVar2 = iVar3 - req->base;
      if (iVar2 != 0 && req->base <= iVar3) {
        ret.valid = true;
        ret.hash_failed.
        super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ret.hash_failed.
        super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ret.hash_failed.
        super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ret.hash_passed.
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ret.hash_passed.
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ret.hash_passed.
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar3 = (req->file).m_val;
        pmVar1 = (this->m_merkle_trees->
                 super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                 ).
                 super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar2 = merkle_to_flat_index(iVar2,req->index);
        file_piece_offset = file_storage::piece_index_at_file(this->m_files,(req->file).m_val);
        uncle_hashes.m_len = hashes.m_len - lVar6;
        uncle_hashes.m_ptr = hashes.m_ptr + lVar6;
        hashes_00.m_len = lVar6;
        hashes_00.m_ptr = hashes.m_ptr;
        merkle_tree::add_hashes
                  (&results,pmVar1 + iVar3,iVar2,(diff_type)file_piece_offset.m_val,hashes_00,
                   uncle_hashes);
        if (results.super__Optional_base<libtorrent::aux::add_hashes_result_t,_false,_false>.
            _M_payload.
            super__Optional_payload<libtorrent::aux::add_hashes_result_t,_true,_false,_false>.
            super__Optional_payload_base<libtorrent::aux::add_hashes_result_t>._M_engaged == false)
        {
          __return_storage_ptr__->valid = false;
          (__return_storage_ptr__->hash_failed).
          super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->hash_failed).
          super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->hash_failed).
          super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->hash_passed).
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->hash_passed).
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->hash_passed).
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        else {
          ::std::
          vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::_M_move_assign(&ret.hash_failed,
                           (undefined1 *)
                           ((long)&results.
                                   super__Optional_base<libtorrent::aux::add_hashes_result_t,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<libtorrent::aux::add_hashes_result_t,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<libtorrent::aux::add_hashes_result_t>
                                   ._M_payload + 0x18));
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::_M_move_assign(&ret.hash_passed,&results);
          add_hashes_result::add_hashes_result(__return_storage_ptr__,&ret);
        }
        ::std::_Optional_payload_base<libtorrent::aux::add_hashes_result_t>::_M_reset
                  ((_Optional_payload_base<libtorrent::aux::add_hashes_result_t> *)&results);
        add_hashes_result::~add_hashes_result(&ret);
        return __return_storage_ptr__;
      }
    }
  }
LAB_001b8e8f:
  __return_storage_ptr__->valid = false;
  (__return_storage_ptr__->hash_failed).
  super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->hash_failed).
  super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->hash_failed).
  super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->hash_passed).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->hash_passed).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->hash_passed).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

add_hashes_result hash_picker::add_hashes(hash_request const& req, span<sha256_hash const> hashes)
	{
		TORRENT_ASSERT(validate_hash_request(req, m_files));

		int const unpadded_count = std::min(req.count, m_files.file_num_pieces(req.file) - req.index);
		int const leaf_count = merkle_num_leafs(req.count);
		int const base_num_layers = merkle_num_layers(leaf_count);
		int const num_uncle_hashes = std::max(0, req.proof_layers - base_num_layers + 1);

		if (req.count + num_uncle_hashes != hashes.size())
			return add_hashes_result(false);

		// for now we rely on only requesting piece hashes in 512 chunks
		if (req.base == m_piece_layer
			&& req.count != 512
			&& (req.count > 512 || unpadded_count != m_files.file_num_pieces(req.file) - req.index))
			return add_hashes_result(false);

		// for now we only support receiving hashes at the piece and leaf layers
		if (req.base != m_piece_layer && req.base != 0)
			return add_hashes_result(false);

		// the incoming list of hashes is really two separate lists, the lowest
		// layer of hashes we requested (typically the block- or piece layer).
		// There are req.count of those, then there are the uncle hashes
		// required to prove the correctness of the first hashes, to anchor the
		// new hashes in the existing tree
		auto const uncle_hashes = hashes.subspan(req.count);
		hashes = hashes.first(req.count);

		TORRENT_ASSERT(uncle_hashes.size() == num_uncle_hashes);

		int const base_layer_idx = file_num_layers(req.file) - req.base;

		if (base_layer_idx <= 0)
			return add_hashes_result(false);

		add_hashes_result ret(true);

		auto& dst_tree = m_merkle_trees[req.file];
		int const dest_start_idx = merkle_to_flat_index(base_layer_idx, req.index);
		auto const file_piece_offset = m_files.piece_index_at_file(req.file) - piece_index_t{0};
		auto results = dst_tree.add_hashes(dest_start_idx, file_piece_offset, hashes, uncle_hashes);

		if (!results)
			return add_hashes_result(false);

		ret.hash_failed = std::move(results->failed);
		ret.hash_passed = std::move(results->passed);

		return ret;
	}